

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall
TPZMatrix<TFad<6,_double>_>::Subst_Forward
          (TPZMatrix<TFad<6,_double>_> *this,TPZFMatrix<TFad<6,_double>_> *B)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int iVar2;
  long lVar3;
  int64_t i;
  long lVar4;
  int64_t r;
  long lVar5;
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> local_158;
  undefined **local_148;
  undefined1 local_140 [16];
  undefined **local_130;
  double local_128;
  double dStack_120;
  double local_118;
  double dStack_110;
  double local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  TFad<6,_double> local_f0;
  TFad<6,_double> local_b0;
  TFad<6,_double> local_70;
  
  lVar5 = (B->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.fRow;
  iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])();
  iVar2 = 0;
  if ((lVar5 == CONCAT44(extraout_var,iVar1)) && ((this->super_TPZBaseMatrix).fDecomposed == '\x03')
     ) {
    lVar5 = 0;
    local_148 = &PTR__TFad_0166af08;
    while( true ) {
      iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
      if (CONCAT44(extraout_var_00,iVar1) <= lVar5) break;
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                (&local_f0,this,lVar5,lVar5);
      for (lVar3 = 0; lVar3 < (B->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.fCol;
          lVar3 = lVar3 + 1) {
        local_130 = local_148;
        local_108 = 0.0;
        uStack_100 = 0;
        local_118 = 0.0;
        dStack_110 = 0.0;
        local_128 = 0.0;
        dStack_120 = 0.0;
        local_f8 = 0;
        for (lVar4 = 0; lVar5 != lVar4; lVar4 = lVar4 + 1) {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_70,this,lVar5,lVar4);
          (*(B->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x24])(&local_b0,B,lVar4,lVar3);
          local_158.fadexpr_.left_ = &local_70;
          local_158.fadexpr_.right_ = &local_b0;
          TFad<6,double>::operator+=((TFad<6,double> *)&local_130,&local_158);
        }
        (*(B->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.super_TPZSavable.
          _vptr_TPZSavable[0x24])(&local_b0,B,lVar5,lVar3);
        local_140._8_8_ = &local_130;
        local_158.fadexpr_.left_ = (TFad<6,_double> *)local_140;
        local_158.fadexpr_.right_ = &local_f0;
        local_140._0_8_ = &local_b0;
        TFad<6,double>::
        TFad<TFadBinaryDiv<TFadExpr<TFadBinaryMinus<TFad<6,double>,TFad<6,double>>>,TFad<6,double>>>
                  ((TFad<6,double> *)&local_70,
                   (TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMinus<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
                    *)&local_158);
        (*(B->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.super_TPZSavable.
          _vptr_TPZSavable[0x23])(B,lVar5,lVar3,&local_70);
      }
      lVar5 = lVar5 + 1;
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int TPZMatrix<TVar>::Subst_Forward( TPZFMatrix<TVar> *B ) const {
	if ( (B->Rows() != Dim()) || !fDecomposed || fDecomposed != ECholesky)
		return( 0 );
	for ( int64_t r = 0; r < Dim(); r++ ) {
		TVar pivot = GetVal( r, r );
		for ( int64_t c = 0; c < B->Cols();  c++ ) {
			// Faz sum = SOMA( A[r,i] * B[i,c] ); i = 0, ..., r-1.
			//
			TVar sum = 0.0;
			for ( int64_t i = 0; i < r; i++ ) sum += GetVal(r, i) * B->GetVal(i, c);
			
			// Faz B[r,c] = (B[r,c] - sum) / A[r,r].
			//
			B->PutVal( r, c, (B->GetVal(r, c) - sum) / pivot );
		}
	}
	return( 1 );
}